

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_int64(void)

{
  byte bVar1;
  undefined8 uVar2;
  int64_t iVar3;
  undefined8 uVar4;
  int64_t *piVar5;
  bson_t *bcon;
  int64_t i64;
  
  uVar2 = bson_bcon_magic();
  iVar3 = bcon_ensure_int64(10);
  uVar2 = bcon_new(0,"foo",uVar2,0x11,iVar3);
  uVar4 = bson_bcone_magic();
  piVar5 = bcon_ensure_int64_ptr((int64_t *)&bcon);
  bVar1 = bcon_extract(uVar2,"foo",uVar4,0x11,piVar5,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x10c,"test_int64","BCON_EXTRACT (bcon, \"foo\", BCONE_INT64 (i64))");
    abort();
  }
  if (bcon != (bson_t *)0xa) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x10e,"test_int64","i64 == 10");
    abort();
  }
  bson_destroy(uVar2);
  return;
}

Assistant:

static void
test_int64 (void)
{
   int64_t i64;

   bson_t *bcon = BCON_NEW ("foo", BCON_INT64 (10));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_INT64 (i64)));

   BSON_ASSERT (i64 == 10);

   bson_destroy (bcon);
}